

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

void __thiscall
cmFileCommand::AddEvaluationFile
          (cmFileCommand *this,string *inputName,string *outputExpr,string *condition,
          bool inputIsContent)

{
  auto_ptr<cmCompiledGeneratorExpression> conditionCge;
  auto_ptr<cmCompiledGeneratorExpression> outputCge;
  cmGeneratorExpression conditionGe;
  cmGeneratorExpression outputGe;
  cmListFileBacktrace lfbt;
  auto_ptr<cmCompiledGeneratorExpression> local_b8;
  auto_ptr<cmCompiledGeneratorExpression> local_b0;
  auto_ptr<cmCompiledGeneratorExpression> local_a8;
  auto_ptr<cmCompiledGeneratorExpression> local_a0;
  undefined1 local_98 [40];
  string local_70;
  cmListFileBacktrace local_50;
  
  cmMakefile::GetBacktrace(&local_50,(this->super_cmCommand).Makefile);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&local_70,&local_50);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)(local_98 + 8),&local_70);
  local_b0.x_ = (cmCompiledGeneratorExpression *)local_98._8_8_;
  local_98._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_98 + 8));
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)(local_98 + 8),&local_50);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_98,(string *)(local_98 + 8));
  local_b8.x_ = (cmCompiledGeneratorExpression *)local_98._0_8_;
  local_98._0_8_ = (cmState *)0x0;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_98);
  local_a0.x_ = local_b0.x_;
  local_a8.x_ = local_b8.x_;
  local_b0.x_ = (cmCompiledGeneratorExpression *)0x0;
  local_b8.x_ = (cmCompiledGeneratorExpression *)0x0;
  cmMakefile::AddEvaluationFile
            ((this->super_cmCommand).Makefile,inputName,&local_a0,&local_a8,inputIsContent);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_a8);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_a0);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_b8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_98 + 8));
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_b0);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_70);
  cmListFileBacktrace::~cmListFileBacktrace(&local_50);
  return;
}

Assistant:

void cmFileCommand::AddEvaluationFile(const std::string& inputName,
                                      const std::string& outputExpr,
                                      const std::string& condition,
                                      bool inputIsContent)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();

  cmGeneratorExpression outputGe(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> outputCge =
    outputGe.Parse(outputExpr);

  cmGeneratorExpression conditionGe(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> conditionCge =
    conditionGe.Parse(condition);

  this->Makefile->AddEvaluationFile(inputName, outputCge, conditionCge,
                                    inputIsContent);
}